

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg,
          Desc<google::protobuf::json_internal::UnparseProto2Descriptor> *desc,bool is_top_level)

{
  bool bVar1;
  undefined8 uVar2;
  StatusOr<long> SVar3;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *pMVar4;
  bool bVar5;
  MessageType MVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Field f;
  long lVar11;
  Field pFVar12;
  Descriptor *pDVar13;
  Message *this_00;
  MessageLite *this_01;
  byte bVar14;
  char *extraout_RDX;
  byte c;
  char *pcVar15;
  string *this_02;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *this_03;
  int iVar16;
  int iVar17;
  size_t sVar18;
  size_t sVar19;
  string_view name;
  string_view ws;
  string_view data;
  string_view name_00;
  string_view ws_00;
  size_t sVar20;
  undefined8 uVar21;
  bool first;
  char *local_148;
  int32_t K;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  StatusOr<long> secs;
  int32_t hour;
  int32_t min;
  int32_t sec;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *local_a8;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_a0;
  string_view sign;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> type_url;
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_58;
  string *local_48;
  Field local_40;
  anon_union_4_2_a3c22f61_for_StatusOrData<int>_3 local_34;
  
  name._M_str = (char *)msg;
  name._M_len = (size_t)desc->all_names_[1]._M_dataplus._M_p;
  MVar6 = ClassifyMessage((json_internal *)desc->all_names_[1]._M_string_length,name);
  switch(MVar6) {
  case kAny:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    f = Proto2Descriptor::MustHaveField(desc,2);
    sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    local_a8 = msg;
    sVar19 = UnparseProto2Descriptor::GetSize(f,msg);
    if (sVar19 == 0 && sVar20 == 0) {
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{}",2);
      *(undefined8 *)this = 1;
      return (Status)(uintptr_t)this;
    }
    if (sVar20 == 0) {
      pcVar15 = "broken Any: missing type URL";
      uVar21 = 0x1c;
    }
    else {
      if ((sVar19 != 0) || ((writer->options_).allow_legacy_syntax != false)) {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
        writer->indent_ = writer->indent_ + 1;
        UnparseProto2Descriptor::GetString(&type_url,pFVar12,&writer->scratch_buf_,local_a8);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&type_url);
        if (*(long *)this != 1) goto LAB_0029a191;
        absl::lts_20240722::Status::~Status((Status *)this);
        JsonWriter::NewLine(writer);
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"@type\":",8);
        ws._M_str = " ";
        ws._M_len = 1;
        JsonWriter::Whitespace(writer,ws);
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                  (&type_url.
                    super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
        local_58.value.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len =
             type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
             field_1.data_._M_len;
        local_58.value.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_str =
             type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
             field_1.data_._M_str;
        JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>(writer,&local_58);
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                  (&type_url.
                    super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&sign,
                   &type_url.
                    super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                    field_1.data_,(allocator<char> *)&local_a0);
        pMVar4 = local_a8;
        lVar11 = std::__cxx11::string::rfind((char)&sign,0x2f);
        if (lVar11 + 1U < 2) {
          bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>._0_16_ =
               absl::lts_20240722::NullSafeStringView
                         ("@type must contain at least one / and a nonempty host; got: ");
          secs.super_StatusOrData<long>.field_1.data_ = sign._M_len;
          secs.super_StatusOrData<long>.field_0 =
               (anon_union_8_1_1246618d_for_StatusOrData<long>_1)sign._M_str;
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&first,(AlphaNum *)&bytes);
          absl::lts_20240722::InvalidArgumentError(this,local_148,_first);
          this_02 = (string *)&first;
LAB_00299e9b:
          std::__cxx11::string::~string(this_02);
        }
        else {
          secs.super_StatusOrData<long> =
               (StatusOrData<long>)
               std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&secs,lVar11 + 1U,
                          0xffffffffffffffff);
          pDVar13 = DescriptorPool::FindMessageTypeByName
                              (desc->file_->pool_,(string_view)secs.super_StatusOrData<long>);
          if (pDVar13 == (Descriptor *)0x0) {
            _first = "could not find @type \'%s\'";
            local_148 = (char *)0x19;
            absl::lts_20240722::
            StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ((string *)&bytes,(FormatSpec<std::__cxx11::basic_string<char>_> *)&first,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sign);
            absl::lts_20240722::InvalidArgumentError
                      (this,bytes.
                            super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                            .field_1.data_._M_len,
                       bytes.
                       super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                       field_0);
            this_02 = (string *)&bytes;
            goto LAB_00299e9b;
          }
          if (sVar19 == 0) {
            bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_1
            .data_._M_str = (char *)0x0;
            uVar21 = 0;
LAB_00299fb0:
            DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&bytes);
            this_00 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&bytes,pDVar13);
            this_01 = &Message::New(this_00)->super_MessageLite;
            data._M_str = bytes.
                          super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                          .field_1.data_._M_str;
            data._M_len = uVar21;
            MessageLite::ParsePartialFromString(this_01,data);
            _first = (char *)((ulong)_first & 0xffffffffffffff00);
            name_00._M_str = extraout_RDX;
            name_00._M_len = (size_t)pDVar13->all_names_[1]._M_dataplus._M_p;
            MVar6 = ClassifyMessage((json_internal *)pDVar13->all_names_[1]._M_string_length,name_00
                                   );
            if (MVar6 == kNotWellKnown) {
              WriteFields<google::protobuf::json_internal::UnparseProto2Descriptor>
                        (this,writer,
                         (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)this_01,
                         pDVar13,&first);
            }
            else {
              JsonWriter::WriteComma(writer,&first);
              JsonWriter::NewLine(writer);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"value\":",8);
              ws_00._M_str = " ";
              ws_00._M_len = 1;
              JsonWriter::Whitespace(writer,ws_00);
              WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                        (this,writer,
                         (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)this_01,
                         pDVar13,false);
            }
            if (*(long *)this == 1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              writer->indent_ = writer->indent_ + -1;
              if (first == false) {
                JsonWriter::NewLine(writer);
              }
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"}",1);
              *(undefined8 *)this = 1;
            }
            (*this_01->_vptr_MessageLite[1])(this_01);
            DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&bytes);
          }
          else {
            UnparseProto2Descriptor::GetString(&bytes,f,&writer->scratch_buf_,pMVar4);
            absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
            if (*(long *)this == 1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              absl::lts_20240722::internal_statusor::
              StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                        (&bytes.
                          super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                        );
              uVar21 = bytes.
                       super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                       field_1.data_._M_len;
              absl::lts_20240722::Status::~Status((Status *)&bytes);
              goto LAB_00299fb0;
            }
            absl::lts_20240722::Status::~Status((Status *)&bytes);
          }
        }
        std::__cxx11::string::~string((string *)&sign);
LAB_0029a191:
        absl::lts_20240722::Status::~Status((Status *)&type_url);
        return (Status)(uintptr_t)this;
      }
      pcVar15 = "broken Any: missing value";
      uVar21 = 0x19;
    }
    absl::lts_20240722::InvalidArgumentError(this,uVar21,pcVar15);
    break;
  case kWrapper:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar20 == 0) {
      WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor>(this,writer,pFVar12);
    }
    else {
      (anonymous_namespace)::
      WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor,google::protobuf::Message_const&>
                ((_anonymous_namespace_ *)this,writer,pFVar12,msg);
    }
    break;
  case kStruct:
    WriteStructValue<google::protobuf::json_internal::UnparseProto2Descriptor>(this,writer,msg,desc)
    ;
    break;
  case kList:
    WriteListValue<google::protobuf::json_internal::UnparseProto2Descriptor>(this,writer,msg,desc);
    break;
  case kValue:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar20 != 0) {
      pcVar15 = "null";
      sVar20 = 4;
      goto LAB_002996eb;
    }
    pFVar12 = Proto2Descriptor::MustHaveField(desc,2);
    sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar20 == 0) {
      pFVar12 = Proto2Descriptor::MustHaveField(desc,3);
      sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
      if (sVar20 == 0) {
        pFVar12 = Proto2Descriptor::MustHaveField(desc,4);
        sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
        if (sVar20 == 0) {
          pFVar12 = Proto2Descriptor::MustHaveField(desc,5);
          sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
          if (sVar20 == 0) {
            pFVar12 = Proto2Descriptor::MustHaveField(desc,6);
            sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
            if (sVar20 == 0) {
              if (!is_top_level) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&bytes,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/json/internal/unparser.cc"
                           ,0x22b,0xc,"is_top_level");
                absl::lts_20240722::log_internal::LogMessage::operator<<
                          ((LogMessage *)&bytes,
                           (char (*) [130])
                           "empty, non-top-level Value must be handled one layer up, since it prints an empty string; reaching this statement is always a bug"
                          );
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)&bytes);
              }
              goto LAB_002996f4;
            }
            UnparseProto2Descriptor::GetMessage((UnparseProto2Descriptor *)&bytes,pFVar12,msg);
            absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
            if (*(long *)this == 1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              pDVar13 = FieldDescriptor::message_type(pFVar12);
              absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>
              ::EnsureOk((StatusOrData<const_google::protobuf::Message_*> *)&bytes);
              WriteListValue<google::protobuf::json_internal::UnparseProto2Descriptor>
                        (this,writer,
                         (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)
                         bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len,pDVar13);
            }
          }
          else {
            UnparseProto2Descriptor::GetMessage((UnparseProto2Descriptor *)&bytes,pFVar12,msg);
            absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
            if (*(long *)this == 1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              pDVar13 = FieldDescriptor::message_type(pFVar12);
              absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>
              ::EnsureOk((StatusOrData<const_google::protobuf::Message_*> *)&bytes);
              WriteStructValue<google::protobuf::json_internal::UnparseProto2Descriptor>
                        (this,writer,
                         (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)
                         bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len,pDVar13);
            }
          }
        }
        else {
          UnparseProto2Descriptor::GetBool((UnparseProto2Descriptor *)&bytes,pFVar12,msg);
          absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            absl::lts_20240722::internal_statusor::StatusOrData<bool>::EnsureOk
                      ((StatusOrData<bool> *)&bytes);
            pcVar15 = "false";
            if ((ulong)(byte)bytes.
                             super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                             .field_1.data_._M_len._0_1_ != 0) {
              pcVar15 = "true";
            }
            io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                      (&writer->sink_,pcVar15,
                       (ulong)(byte)bytes.
                                    super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    .field_1.data_._M_len._0_1_ ^ 5);
            *(undefined8 *)this = 1;
          }
        }
      }
      else {
        UnparseProto2Descriptor::GetString(&bytes,pFVar12,&writer->scratch_buf_,msg);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                    (&bytes.
                      super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
          secs.super_StatusOrData<long>.field_1 =
               (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
               bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
               field_1.data_._M_str;
          secs.super_StatusOrData<long>.field_0 =
               (anon_union_8_1_1246618d_for_StatusOrData<long>_1)
               bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
               field_1.data_._M_len;
          JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                    (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)&secs)
          ;
          *(undefined8 *)this = 1;
        }
      }
    }
    else {
      UnparseProto2Descriptor::GetDouble((UnparseProto2Descriptor *)&bytes,pFVar12,msg);
      absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                  ((StatusOrData<double> *)&bytes);
        if (NAN((double)bytes.
                        super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                        field_1.data_._M_len)) {
          pcVar15 = 
          "google.protobuf.Value cannot encode double values for nan, because it would be parsed as a string"
          ;
          uVar21 = 0x61;
        }
        else {
          absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                    ((StatusOrData<double> *)&bytes);
          pcVar15 = 
          "google.protobuf.Value cannot encode double values for infinity, because it would be parsed as a string"
          ;
          uVar21 = 0x66;
          if (((double)bytes.
                       super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                       field_1.data_._M_len < INFINITY) &&
             (absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                        ((StatusOrData<double> *)&bytes),
             -INFINITY <
             (double)bytes.
                     super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                     field_1.data_._M_len)) {
            absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                      ((StatusOrData<double> *)&bytes);
            JsonWriter::Write(writer,(double)bytes.
                                             super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                             .field_1.data_._M_len);
            *(undefined8 *)this = 1;
            goto LAB_0029a266;
          }
        }
        absl::lts_20240722::InvalidArgumentError(this,uVar21,pcVar15);
      }
    }
LAB_0029a266:
    this_03 = &bytes;
    goto LAB_0029a38b;
  default:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
    writer->indent_ = writer->indent_ + 1;
    bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_0.status_
    .rep_._0_1_ = 1;
    WriteFields<google::protobuf::json_internal::UnparseProto2Descriptor>
              (this,writer,msg,desc,(bool *)&bytes);
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    writer->indent_ = writer->indent_ + -1;
    if (bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_0.
        status_.rep_._0_1_ == '\0') {
      JsonWriter::NewLine(writer);
    }
    pcVar15 = "}";
    sVar20 = 1;
LAB_002996eb:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,pcVar15,sVar20);
    goto LAB_002996f4;
  case kTimestamp:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar20 == 0) {
      secs.super_StatusOrData<long> = (StatusOrData<long>)ZEXT816(1);
    }
    else {
      UnparseProto2Descriptor::GetInt64((UnparseProto2Descriptor *)&secs,pFVar12,msg);
    }
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&secs);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                (&secs.super_StatusOrData<long>);
      if ((long)secs.super_StatusOrData<long>.field_1 < -0xe7791f700) {
        pcVar15 = "minimum acceptable time value is 0001-01-01T00:00:00Z";
      }
      else {
        absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                  (&secs.super_StatusOrData<long>);
        if (secs.super_StatusOrData<long>.field_1.data_ < 0x3afff44180) {
          absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                    (&secs.super_StatusOrData<long>);
          secs.super_StatusOrData<long>.field_1.data_ =
               secs.super_StatusOrData<long>.field_1.data_ + 0xe7791f700;
          pFVar12 = Proto2Descriptor::MustHaveField(desc,2);
          sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
          if (sVar20 == 0) {
            local_148 = (char *)((ulong)local_148 & 0xffffffff00000000);
            _first = (char *)0x1;
          }
          else {
            UnparseProto2Descriptor::GetInt32((UnparseProto2Descriptor *)&first,pFVar12,msg);
          }
          absl::lts_20240722::Status::Status((Status *)this,(Status *)&first);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&secs.super_StatusOrData<long>);
            iVar8 = (int)(secs.super_StatusOrData<long>.field_1.data_ / 0x15180);
            iVar7 = (iVar8 * 4 + 0x6d40ac) / 0x23ab1;
            iVar17 = (iVar7 * 0x23ab1 + 3) / -4 + iVar8 + 0x1b502b;
            iVar8 = (iVar17 * 4000 + 4000) / 0x164b09;
            iVar9 = (iVar8 * 0x5b5) / -4;
            iVar16 = (iVar9 + iVar17 + 0x1f) * 0x50;
            iVar10 = iVar16 / 0x98f;
            K = (iVar10 * 0x98f) / -0x50 + iVar17 + iVar9 + 0x1f;
            iVar16 = iVar16 / 0x6925;
            local_a0.data_._0_4_ = iVar16 * -0xc + iVar10 + 2;
            local_58.value.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
            super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
            _M_head_impl._M_len =
                 CONCAT44(local_58.value.
                          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          .
                          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                          ._M_head_impl._M_len._4_4_,iVar16 + iVar7 * 100 + iVar8 + -0x1324);
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&secs.super_StatusOrData<long>);
            sec = (int32_t)(secs.super_StatusOrData<long>.field_1.data_ % 0x3c);
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&secs.super_StatusOrData<long>);
            min = (int32_t)((secs.super_StatusOrData<long>.field_1.data_ / 0x3c) % 0x3c);
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&secs.super_StatusOrData<long>);
            hour = (int32_t)((secs.super_StatusOrData<long>.field_1.data_ / 0xe10) % 0x18);
            absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                      ((StatusOrData<int> *)&first);
            if (local_148._0_4_ == 0) {
              sign._M_len = (size_t)anon_var_dwarf_760f59;
              sign._M_str = (char *)0x20;
              absl::lts_20240722::StrFormat<int,_int,_int,_int,_int,_int>
                        ((string *)&bytes,(FormatSpec<int,_int,_int,_int,_int,_int> *)&sign,
                         (int *)&local_58,(int *)&local_a0.data_,&K,&hour,&min,&sec);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,
                         (char *)bytes.
                                 super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                 .field_0,
                         bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len);
            }
            else {
              absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                        ((StatusOrData<int> *)&first);
              local_34.data_ = -local_148._0_4_;
              if (0 < local_148._0_4_) {
                local_34.data_ = local_148._0_4_;
              }
              type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                         )0x9;
              while ((uint)local_34.data_ % 1000 == 0) {
                type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                field_0 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                           )((long)type_url.
                                   super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   .field_0 + -3);
                local_34.data_ = local_34.data_ / 1000;
              }
              sign._M_len = (size_t)anon_var_dwarf_760f73;
              sign._M_str = (char *)0x25;
              absl::lts_20240722::
              StrFormat<int,_int,_int,_int,_int,_int,_unsigned_long,_unsigned_int>
                        ((string *)&bytes,
                         (FormatSpec<int,_int,_int,_int,_int,_int,_unsigned_long,_unsigned_int> *)
                         &sign,(int *)&local_58,(int *)&local_a0.data_,&K,&hour,&min,&sec,
                         (unsigned_long *)&type_url,(uint *)&local_34.data_);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,
                         (char *)bytes.
                                 super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                 .field_0,
                         bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len);
            }
            std::__cxx11::string::~string((string *)&bytes);
            *(undefined8 *)this = 1;
          }
          absl::lts_20240722::Status::~Status((Status *)&first);
          goto LAB_0029a386;
        }
        pcVar15 = "maximum acceptable time value is 9999-12-31T23:59:59Z";
      }
      absl::lts_20240722::InvalidArgumentError(this,0x35,pcVar15);
    }
    goto LAB_0029a386;
  case kDuration:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar20 == 0) {
      secs.super_StatusOrData<long> = (StatusOrData<long>)ZEXT816(1);
    }
    else {
      UnparseProto2Descriptor::GetInt64((UnparseProto2Descriptor *)&secs,pFVar12,msg);
    }
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&secs);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                (&secs.super_StatusOrData<long>);
      if (secs.super_StatusOrData<long>.field_1.data_ < 0x4979cb9e01) {
        absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                  (&secs.super_StatusOrData<long>);
        if (-0x4979cb9e01 < secs.super_StatusOrData<long>.field_1.data_) {
          pFVar12 = Proto2Descriptor::MustHaveField(desc,2);
          sVar20 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
          if (sVar20 == 0) {
            local_148 = (char *)((ulong)local_148 & 0xffffffff00000000);
            _first = (char *)0x1;
          }
          else {
            UnparseProto2Descriptor::GetInt32((UnparseProto2Descriptor *)&first,pFVar12,msg);
          }
          absl::lts_20240722::Status::Status((Status *)this,(Status *)&first);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                      ((StatusOrData<int> *)&first);
            pcVar15 = "duration out of range";
            uVar21 = 0x15;
            if (local_148._0_4_ < 1000000000) {
              absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                        ((StatusOrData<int> *)&first);
              if (-1000000000 < local_148._0_4_) {
                absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                          (&secs.super_StatusOrData<long>);
                if (secs.super_StatusOrData<long>.field_1.data_ != 0) {
                  absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                            ((StatusOrData<int> *)&first);
                  if (local_148._0_4_ != 0) {
                    absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                              (&secs.super_StatusOrData<long>);
                    SVar3 = secs;
                    absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                              ((StatusOrData<int> *)&first);
                    if ((uint)local_148._0_4_ >> 0x1f !=
                        -(SVar3.super_StatusOrData<long>.field_1._4_4_ >> 0x1f)) {
                      pcVar15 = "nanos and seconds signs do not match";
                      uVar21 = 0x24;
                      goto LAB_00299c1a;
                    }
                  }
                }
                absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                          ((StatusOrData<int> *)&first);
                if (local_148._0_4_ == 0) {
                  sign._M_len = (size_t)anon_var_dwarf_760fa5;
                  sign._M_str = (char *)0x5;
                  absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                            (&secs.super_StatusOrData<long>);
                  absl::lts_20240722::StrFormat<long>
                            ((string *)&bytes,(FormatSpec<long> *)&sign,
                             &secs.super_StatusOrData<long>.field_1.data_);
                  io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                            (&writer->sink_,
                             (char *)bytes.
                                     super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     .field_0,
                             bytes.
                             super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                             .field_1.data_._M_len);
                }
                else {
                  absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                            ((StatusOrData<int> *)&first);
                  K = -local_148._0_4_;
                  if (0 < local_148._0_4_) {
                    K = local_148._0_4_;
                  }
                  local_58.value.
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                  super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                  ._M_head_impl._M_len = 9;
                  while ((uint)K % 1000 == 0) {
                    local_58.value.
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                    super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                    ._M_head_impl._M_len =
                         local_58.value.
                         super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         .
                         super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                         ._M_head_impl._M_len - 3;
                    K = (uint)K / 1000;
                  }
                  absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                            (&secs.super_StatusOrData<long>);
                  if (secs.super_StatusOrData<long>.field_1.data_ < 0) {
                    sign._M_str = "-";
                  }
                  else {
                    absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                              ((StatusOrData<int> *)&first);
                    sign._M_str = "";
                    if (local_148._0_4_ < 0) {
                      sign._M_str = "-";
                    }
                  }
                  sign._M_len = strlen(sign._M_str);
                  type_url.
                  super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_0
                       = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                          )anon_var_dwarf_760fbd;
                  type_url.
                  super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_1
                  .data_._M_len = 0xc;
                  absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                            (&secs.super_StatusOrData<long>);
                  local_a0.data_ = -secs.super_StatusOrData<long>.field_1.data_;
                  if (0 < secs.super_StatusOrData<long>.field_1.data_) {
                    local_a0.data_ = secs.super_StatusOrData<long>.field_1.data_;
                  }
                  absl::lts_20240722::
                  StrFormat<std::basic_string_view<char,_std::char_traits<char>_>,_long,_unsigned_long,_unsigned_int>
                            ((string *)&bytes,
                             (FormatSpec<std::basic_string_view<char>,_long,_unsigned_long,_unsigned_int>
                              *)&type_url,&sign,&local_a0.data_,(unsigned_long *)&local_58,
                             (uint *)&K);
                  io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                            (&writer->sink_,
                             (char *)bytes.
                                     super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     .field_0,
                             bytes.
                             super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                             .field_1.data_._M_len);
                }
                std::__cxx11::string::~string((string *)&bytes);
                *(undefined8 *)this = 1;
                goto LAB_0029a37c;
              }
            }
LAB_00299c1a:
            absl::lts_20240722::InvalidArgumentError(this,uVar21,pcVar15);
          }
LAB_0029a37c:
          absl::lts_20240722::Status::~Status((Status *)&first);
          goto LAB_0029a386;
        }
      }
      absl::lts_20240722::InvalidArgumentError(this,0x15,"duration out of range");
    }
LAB_0029a386:
    this_03 = (StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&secs;
LAB_0029a38b:
    absl::lts_20240722::Status::~Status((Status *)this_03);
    break;
  case kFieldMask:
    local_40 = Proto2Descriptor::MustHaveField(desc,1);
    sVar20 = UnparseProto2Descriptor::GetSize(local_40,msg);
    JsonWriter::Write(writer,'\"');
    secs.super_StatusOrData<long>.field_0.status_.rep_._0_1_ = 1;
    local_48 = &writer->scratch_buf_;
    local_a8 = msg;
    for (sVar19 = 0; pMVar4 = local_a8, sVar19 != sVar20; sVar19 = sVar19 + 1) {
      JsonWriter::WriteComma(writer,(bool *)&secs);
      UnparseProto2Descriptor::GetString
                ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>,
                 local_40,local_48,pMVar4,sVar19);
      absl::lts_20240722::Status::Status
                ((Status *)this,
                 (Status *)
                 &bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
      if (*(long *)this != 1) goto LAB_0029a266;
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                (&bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
      uVar2 = bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_1.data_._M_str;
      uVar21 = bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
               field_1.data_._M_len;
      bVar1 = false;
      for (sVar18 = 0; uVar21 != sVar18; sVar18 = sVar18 + 1) {
        c = *(byte *)(uVar2 + sVar18);
        if ((byte)(c + 0x9f) < 0x1a) {
          if (bVar1) {
            c = *(byte *)((long)&absl::lts_20240722::ascii_internal::kToUpper + (ulong)c);
          }
LAB_0029965b:
          JsonWriter::Write(writer,c);
          bVar5 = false;
        }
        else {
          if (c == 0x2e || (byte)(c - 0x30) < 10) goto LAB_0029965b;
          if (c != 0x5f) {
            bVar14 = (writer->options_).allow_legacy_syntax;
LAB_00299643:
            if ((bVar14 & 1) != 0) {
              if (bVar1) {
                JsonWriter::Write(writer,'_');
              }
              goto LAB_0029965b;
            }
            absl::lts_20240722::InvalidArgumentError(this,0x21,"unexpected character in FieldMask");
            goto LAB_0029a266;
          }
          bVar5 = true;
          if ((bVar1) && (bVar14 = (writer->options_).allow_legacy_syntax, (bool)bVar14 == false))
          goto LAB_00299643;
        }
        bVar1 = bVar5;
      }
      absl::lts_20240722::Status::~Status((Status *)&bytes);
    }
    JsonWriter::Write(writer,'\"');
LAB_002996f4:
    *(undefined8 *)this = 1;
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteMessage(JsonWriter& writer, const Msg<Traits>& msg,
                          const Desc<Traits>& desc, bool is_top_level) {
  switch (ClassifyMessage(Traits::TypeName(desc))) {
    case MessageType::kAny:
      return WriteAny<Traits>(writer, msg, desc);
    case MessageType::kWrapper: {
      auto field = Traits::MustHaveField(desc, 1);
      if (Traits::GetSize(field, msg) == 0) {
        return WriteSingular<Traits>(writer, field);
      }
      return WriteSingular<Traits>(writer, field, msg);
    }
    case MessageType::kValue:
      return WriteValue<Traits>(writer, msg, desc, is_top_level);
    case MessageType::kStruct:
      return WriteStructValue<Traits>(writer, msg, desc);
    case MessageType::kList:
      return WriteListValue<Traits>(writer, msg, desc);
    case MessageType::kTimestamp:
      return WriteTimestamp<Traits>(writer, msg, desc);
    case MessageType::kDuration:
      return WriteDuration<Traits>(writer, msg, desc);
    case MessageType::kFieldMask:
      return WriteFieldMask<Traits>(writer, msg, desc);
    default: {
      writer.Write("{");
      writer.Push();
      bool first = true;
      RETURN_IF_ERROR(WriteFields<Traits>(writer, msg, desc, first));
      writer.Pop();
      if (!first) {
        writer.NewLine();
      }
      writer.Write("}");
      return absl::OkStatus();
    }
  }
}